

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

Maybe<capnp::Capability::Client> * __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::inboundCall
          (Maybe<capnp::Capability::Client> *__return_storage_ptr__,MembranePolicyImpl *this,
          uint64_t interfaceId,uint16_t methodId,Client *target)

{
  uint64_t uVar1;
  Own<capnp::_::(anonymous_namespace)::ThingImpl> local_50;
  Client local_40;
  Client *local_30;
  Client *target_local;
  uint64_t uStack_20;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  MembranePolicyImpl *this_local;
  
  local_30 = target;
  target_local._6_2_ = methodId;
  uStack_20 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local = (MembranePolicyImpl *)__return_storage_ptr__;
  uVar1 = typeId<capnproto_test::capnp::test::TestMembrane::Thing,capnproto_test::capnp::test::TestMembrane::Thing::_capnpPrivate>
                    ();
  if ((interfaceId == uVar1) && (target_local._6_2_ == 1)) {
    kj::heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
              ((kj *)&local_50,(char (*) [8])"inbound");
    Capability::Client::Client<capnp::_::(anonymous_namespace)::ThingImpl,void>(&local_40,&local_50)
    ;
    kj::Maybe<capnp::Capability::Client>::Maybe(__return_storage_ptr__,&local_40);
    Capability::Client::~Client(&local_40);
    kj::Own<capnp::_::(anonymous_namespace)::ThingImpl>::~Own(&local_50);
  }
  else {
    kj::Maybe<capnp::Capability::Client>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Capability::Client> inboundCall(uint64_t interfaceId, uint16_t methodId,
                                            Capability::Client target) override {
    if (interfaceId == capnp::typeId<Thing>() && methodId == 1) {
      return Capability::Client(kj::heap<ThingImpl>("inbound"));
    } else {
      return nullptr;
    }
  }